

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void FCanvasTextureInfo::EmptyList(void)

{
  FCanvasTextureInfo *pFVar1;
  FCanvasTextureInfo *next;
  FCanvasTextureInfo *probe;
  
  next = List;
  pFVar1 = next;
  while (next = pFVar1, next != (FCanvasTextureInfo *)0x0) {
    pFVar1 = next->Next;
    (*(next->Texture->super_FTexture)._vptr_FTexture[9])();
    if (next != (FCanvasTextureInfo *)0x0) {
      operator_delete(next,0x20);
    }
  }
  List = (FCanvasTextureInfo *)0x0;
  return;
}

Assistant:

void FCanvasTextureInfo::EmptyList ()
{
	FCanvasTextureInfo *probe, *next;

	for (probe = List; probe != NULL; probe = next)
	{
		next = probe->Next;
		probe->Texture->Unload();
		delete probe;
	}
	List = NULL;
}